

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifwrd(bifcxdef *ctx,int argc)

{
  long lVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long in_RDI;
  runsdef val;
  uint len;
  uchar *src;
  uchar *dst;
  uchar buf [128];
  vocoldef *v;
  int ob;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 uVar5;
  dattyp typ;
  undefined7 in_stack_ffffffffffffff41;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [2];
  undefined1 local_96 [126];
  vocoldef *local_18;
  int local_10;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
            in_stack_ffffffffffffff2c);
  }
  uVar5 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  iVar2 = (int)uVar5;
  local_10 = iVar2;
  if (iVar2 == 1) {
    local_18 = *(vocoldef **)(*(long *)(*(long *)(in_RDI + 8) + 0x70) + 0x1110);
  }
  else {
    if (iVar2 != 2) {
      runpnil((runcxdef *)CONCAT44(iVar2,in_stack_ffffffffffffff30));
      return;
    }
    local_18 = *(vocoldef **)(*(long *)(*(long *)(in_RDI + 8) + 0x70) + 0x1118);
  }
  if ((((local_18 == (vocoldef *)0x0) || (iVar3 = voclistlen(local_18), iVar3 == 0)) ||
      (local_18->vocolfst == (char *)0x0)) || (local_18->vocollst == (char *)0x0)) {
    typ = (dattyp)((ulong)uVar5 >> 0x20);
    local_a0 = local_96;
  }
  else {
    local_a0 = local_96;
    for (local_a8 = local_18->vocolfst; typ = (dattyp)((ulong)uVar5 >> 0x20),
        local_a8 <= local_18->vocollst; local_a8 = local_a8 + (iVar3 + 1)) {
      *local_a0 = 3;
      sVar4 = strlen(local_a8);
      iVar3 = (int)sVar4;
      oswp2(local_a0 + 1,iVar3 + 2);
      strcpy(local_a0 + 3,local_a8);
      local_a0 = local_a0 + 1 + (iVar3 + 2);
    }
  }
  oswp2(local_98,(int)local_a0 - (int)local_98);
  runpush((runcxdef *)CONCAT71(in_stack_ffffffffffffff41,7),typ,
          (runsdef *)CONCAT44(iVar2,in_stack_ffffffffffffff30));
  return;
}

Assistant:

void bifwrd(bifcxdef *ctx, int argc)
{
    int       ob;
    vocoldef *v;
    uchar     buf[128];
    uchar    *dst;
    uchar    *src;
    uint      len;
    runsdef   val;
    
    bifcntargs(ctx, 1, argc);

    /* figure out what word list to get */
    ob = runpopnum(ctx->bifcxrun);
    switch(ob)
    {
    case 1:
        v = ctx->bifcxrun->runcxvoc->voccxdobj;
        break;

    case 2:
        v = ctx->bifcxrun->runcxvoc->voccxiobj;
        break;

    default:
        runpnil(ctx->bifcxrun);
        return;
    }

    /* now build a list of strings from the words, if there are any */
    if (v != 0 && voclistlen(v) != 0 && v->vocolfst != 0 && v->vocollst != 0)
    {
        for (dst = buf + 2, src = (uchar *)v->vocolfst ;
             src <= (uchar *)v->vocollst ; src += len + 1)
        {
            *dst++ = DAT_SSTRING;
            len = strlen((char *)src);
            oswp2(dst, len + 2);
            strcpy((char *)dst + 2, (char *)src);
            dst += len + 2;
        }
    }
    else
        dst = buf + 2;

    /* finish setting up the list length and return it */
    len = dst - buf;
    oswp2(buf, len);
    val.runsv.runsvstr = buf;
    val.runstyp = DAT_LIST;
    runpush(ctx->bifcxrun, DAT_LIST, &val);
}